

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
spirv_cross::Compiler::interface_variable_exists_in_entry_point(Compiler *this,uint32_t id)

{
  _Hash_node_base *p_Var1;
  SPIRVariable *pSVar2;
  __node_base_ptr p_Var3;
  TypedID<(spirv_cross::Types)2> *pTVar4;
  runtime_error *this_00;
  ulong __code;
  bool bVar5;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pSVar2 = Variant::get<spirv_cross::SPIRVariable>
                     ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + id);
  if ((StorageClassInput < pSVar2->storage) && (pSVar2->storage != StorageClassOutput)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,
               "Only Input, Output variables and Uniform constants are part of a shader linking interface."
               ,"");
    ::std::runtime_error::runtime_error(this_00,(string *)local_40);
    *(undefined ***)this_00 = &PTR__runtime_error_0035b0b8;
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar5 = true;
  if (1 < (this->ir).entry_points._M_h._M_element_count) {
    __code = (ulong)(this->ir).default_entry_point.id;
    p_Var3 = ::std::
             _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)4>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       (&(this->ir).entry_points._M_h,
                        __code % (this->ir).entry_points._M_h._M_bucket_count,
                        &(this->ir).default_entry_point,__code);
    p_Var1 = p_Var3->_M_nxt;
    local_40[0] = (undefined1 *)CONCAT44(local_40[0]._4_4_,id);
    pTVar4 = ::std::
             __find_if<spirv_cross::TypedID<(spirv_cross::Types)2>const*,__gnu_cxx::__ops::_Iter_equals_val<spirv_cross::TypedID<(spirv_cross::Types)2>const>>
                       (p_Var1[0xb]._M_nxt,
                        (long)&(p_Var1[0xb]._M_nxt)->_M_nxt + (long)p_Var1[0xc]._M_nxt * 4);
    bVar5 = pTVar4 != (TypedID<(spirv_cross::Types)2> *)
                      ((long)&(p_Var1[0xb]._M_nxt)->_M_nxt + (long)p_Var1[0xc]._M_nxt * 4);
  }
  return bVar5;
}

Assistant:

bool Compiler::interface_variable_exists_in_entry_point(uint32_t id) const
{
	auto &var = get<SPIRVariable>(id);
	if (var.storage != StorageClassInput && var.storage != StorageClassOutput &&
	    var.storage != StorageClassUniformConstant)
		SPIRV_CROSS_THROW("Only Input, Output variables and Uniform constants are part of a shader linking interface.");

	// This is to avoid potential problems with very old glslang versions which did
	// not emit input/output interfaces properly.
	// We can assume they only had a single entry point, and single entry point
	// shaders could easily be assumed to use every interface variable anyways.
	if (ir.entry_points.size() <= 1)
		return true;

	auto &execution = get_entry_point();
	return find(begin(execution.interface_variables), end(execution.interface_variables), VariableID(id)) !=
	       end(execution.interface_variables);
}